

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

FilePath __thiscall
testing::internal::FilePath::MakeFileName
          (FilePath *this,FilePath *directory,FilePath *base_name,int number,char *extension)

{
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  FilePath FVar2;
  String file;
  String local_38;
  String local_28;
  size_t sVar1;
  
  local_28.c_str_ = (char *)0x0;
  local_28.length_ = 0;
  if (number == 0) {
    String::Format((char *)&local_38,"%s.%s",(base_name->pathname_).c_str_,extension);
    String::operator=(&local_28,&local_38);
  }
  else {
    String::Format((char *)&local_38,"%s_%d.%s",(base_name->pathname_).c_str_);
    String::operator=(&local_28,&local_38);
  }
  if (local_38.c_str_ != (char *)0x0) {
    operator_delete__(local_38.c_str_);
  }
  FilePath((FilePath *)&local_38,&local_28);
  FVar2 = ConcatPaths(this,directory,(FilePath *)&local_38);
  sVar1 = FVar2.pathname_.length_;
  if (local_38.c_str_ != (char *)0x0) {
    operator_delete__(local_38.c_str_);
    sVar1 = extraout_RDX;
  }
  if (local_28.c_str_ != (char *)0x0) {
    operator_delete__(local_28.c_str_);
    sVar1 = extraout_RDX_00;
  }
  FVar2.pathname_.length_ = sVar1;
  FVar2.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar2.pathname_;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  String file;
  if (number == 0) {
    file = String::Format("%s.%s", base_name.c_str(), extension);
  } else {
    file = String::Format("%s_%d.%s", base_name.c_str(), number, extension);
  }
  return ConcatPaths(directory, FilePath(file));
}